

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Table.cpp
# Opt level: O1

void __thiscall Table::measureCell(Table *this,string *data,uint *minimum,uint *maximum)

{
  uint uVar1;
  string stripped;
  string local_38;
  
  Color::strip(&local_38,data);
  uVar1 = longestLine(&local_38);
  *maximum = uVar1;
  uVar1 = longestWord(&local_38);
  *minimum = uVar1;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p);
  }
  return;
}

Assistant:

void Table::measureCell (
  const std::string& data,
  unsigned int& minimum,
  unsigned int& maximum) const
{
  std::string stripped = Color::strip (data);
  maximum = longestLine (stripped);
  minimum = longestWord (stripped);
}